

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

void __thiscall wasm::Literal::Literal(Literal *this,LaneArray<2> *lanes)

{
  undefined8 uVar1;
  reference pvVar2;
  long lVar3;
  size_type __n;
  size_type sVar4;
  long lVar5;
  undefined1 auStack_78 [8];
  array<unsigned_char,_16UL> bytes;
  
  (this->type).id = 6;
  sVar4 = 0;
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    getBits(lanes->_M_elems + lVar3,(uint8_t (*) [16])(bytes._M_elems + 8));
    uVar1 = bytes._M_elems._8_8_;
    __n = sVar4;
    for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 8) {
      pvVar2 = std::array<unsigned_char,_16UL>::at((array<unsigned_char,_16UL> *)auStack_78,__n);
      *pvVar2 = (value_type_conflict1)((ulong)uVar1 >> ((byte)lVar5 & 0x3f));
      __n = __n + 1;
    }
    sVar4 = sVar4 + 8;
  }
  (this->field_0).i64 = (int64_t)auStack_78;
  (this->field_0).func.super_IString.str._M_str = (char *)bytes._M_elems._0_8_;
  return;
}

Assistant:

Literal::Literal(const LaneArray<2>& lanes) : type(Type::v128) {
  extractBytes<uint64_t, 2>(v128, lanes);
}